

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-type.h
# Opt level: O1

BasicHeapType __thiscall wasm::HeapType::getBottom(HeapType *this)

{
  BasicHeapType BVar1;
  BasicHeapType BVar2;
  Shareability SVar3;
  
  BVar2 = getUnsharedBottom(this);
  SVar3 = getShared(this);
  if (BVar2 < 0x7d) {
    BVar1 = BVar2 & 0x7b;
    if (SVar3 == Shared) {
      BVar1 = BVar2 | 4;
    }
    return BVar1;
  }
  __assert_fail("isBasic()",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-type.h"
                ,0xe2,"BasicHeapType wasm::HeapType::getBasic(Shareability) const");
}

Assistant:

BasicHeapType getBottom() const {
    return HeapType(getUnsharedBottom()).getBasic(getShared());
  }